

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeBeginTrans(Btree *p,int wrflag)

{
  int *piVar1;
  u32 uVar2;
  uint uVar3;
  Pgno PVar4;
  BtShared *pBt;
  Pager *pPVar5;
  sqlite3 *psVar6;
  _func_int_void_ptr_int *p_Var7;
  MemPage *pMVar8;
  sqlite3_mutex *psVar9;
  uint uVar10;
  u32 *pPageSize;
  u8 uVar11;
  byte bVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  BtLock *pBVar16;
  u16 uVar17;
  Btree *pBVar18;
  uint uVar19;
  u8 *puVar20;
  uint uVar21;
  Wal *pWVar22;
  u32 uVar23;
  undefined1 auVar24 [16];
  MemPage *pPage1;
  int local_4c;
  Btree *local_48;
  u32 *local_40;
  MemPage *local_38;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if (p->inTrans == '\x02') {
    if (wrflag != 0) {
LAB_0011e33b:
      iVar14 = sqlite3PagerOpenSavepoint(pBt->pPager,p->db->nSavepoint);
      goto LAB_0011ea76;
    }
  }
  else if (wrflag != 0 || p->inTrans != '\x01') {
    uVar13 = pBt->btsFlags;
    if ((wrflag != 0) && (iVar14 = 8, (uVar13 & 1) != 0)) goto LAB_0011ea76;
    if (wrflag == 0) {
      if ((uVar13 & 0x40) != 0) goto LAB_0011e3b3;
    }
    else if (((uVar13 & 0x40) == 0) && (pBt->inTransaction != '\x02')) {
      if (1 < wrflag) {
        for (pBVar16 = pBt->pLock; pBVar16 != (BtLock *)0x0; pBVar16 = pBVar16->pNext) {
          pBVar18 = pBVar16->pBtree;
          if (pBVar18 != p) goto LAB_0011e3b8;
        }
      }
    }
    else {
LAB_0011e3b3:
      pBVar18 = pBt->pWriter;
LAB_0011e3b8:
      iVar14 = 0x106;
      if (pBVar18->db != (sqlite3 *)0x0) goto LAB_0011ea76;
    }
    iVar14 = querySharedCacheTableLock(p,1,'\x01');
    if (iVar14 == 0) {
      uVar13 = pBt->btsFlags;
      pBt->btsFlags = uVar13 & 0xfff7;
      if (pBt->nPage == 0) {
        pBt->btsFlags = uVar13 | 8;
      }
      local_40 = &pBt->pageSize;
      iVar14 = 0;
      local_48 = p;
      do {
        if (pBt->pPage1 == (MemPage *)0x0) {
          do {
            iVar14 = sqlite3PagerSharedLock(pBt->pPager);
            if ((iVar14 != 0) ||
               (iVar14 = btreeGetPage(pBt,1,&local_38,0,0), pMVar8 = local_38, iVar14 != 0))
            goto LAB_0011e932;
            puVar20 = local_38->aData;
            uVar21 = *(uint *)(puVar20 + 0x1c);
            uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                     uVar21 << 0x18;
            uVar2 = pBt->pPager->dbSize;
            if ((uVar21 == 0) || (*(int *)(puVar20 + 0x18) != *(int *)(puVar20 + 0x5c))) {
              uVar21 = uVar2;
            }
            if (0 < (int)uVar21) {
              auVar24[0] = -(*puVar20 == 'S');
              auVar24[1] = -(puVar20[1] == 'Q');
              auVar24[2] = -(puVar20[2] == 'L');
              auVar24[3] = -(puVar20[3] == 'i');
              auVar24[4] = -(puVar20[4] == 't');
              auVar24[5] = -(puVar20[5] == 'e');
              auVar24[6] = -(puVar20[6] == ' ');
              auVar24[7] = -(puVar20[7] == 'f');
              auVar24[8] = -(puVar20[8] == 'o');
              auVar24[9] = -(puVar20[9] == 'r');
              auVar24[10] = -(puVar20[10] == 'm');
              auVar24[0xb] = -(puVar20[0xb] == 'a');
              auVar24[0xc] = -(puVar20[0xc] == 't');
              auVar24[0xd] = -(puVar20[0xd] == ' ');
              auVar24[0xe] = -(puVar20[0xe] == '3');
              auVar24[0xf] = -(puVar20[0xf] == '\0');
              iVar15 = 0x1a;
              iVar14 = iVar15;
              if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
                if (2 < puVar20[0x12]) {
                  *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
                }
                if (puVar20[0x13] < 3) {
                  if ((puVar20[0x13] == 2) && ((pBt->btsFlags & 0x10) == 0)) {
                    local_4c = 0;
                    iVar14 = sqlite3PagerOpenWal(pBt->pPager,&local_4c);
                    if (iVar14 == 0) {
                      if (local_4c != 0) goto LAB_0011e5d1;
                      sqlite3PagerUnref(pMVar8->pDbPage);
                      goto LAB_0011e73c;
                    }
                  }
                  else {
LAB_0011e5d1:
                    pPageSize = local_40;
                    iVar14 = iVar15;
                    if (puVar20[0x17] == ' ' && *(short *)(puVar20 + 0x15) == 0x2040) {
                      uVar10 = (uint)puVar20[0x10] * 0x100;
                      uVar3 = (uint)puVar20[0x11] * 0x10000;
                      if ((0xffff00ff < (uVar3 + uVar10) - 0x10001) &&
                         (uVar19 = uVar3 | uVar10, ((uVar10 + uVar3) - 1 & uVar19) == 0)) {
                        bVar12 = puVar20[0x14];
                        uVar23 = uVar19 - bVar12;
                        if (uVar19 != *local_40) {
                          sqlite3PagerUnref(pMVar8->pDbPage);
                          pBt->usableSize = uVar23;
                          pBt->pageSize = uVar19;
                          pcache1Free(pBt->pTmpSpace);
                          pBt->pTmpSpace = (u8 *)0x0;
                          iVar14 = sqlite3PagerSetPagesize(pBt->pPager,pPageSize,(uint)bVar12);
                          if (iVar14 == 0) goto LAB_0011e73c;
                          goto LAB_0011e932;
                        }
                        if (((pBt->db->flags & 0x8000) == 0) && ((int)uVar2 < (int)uVar21)) {
                          iVar14 = 0xb;
                          sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xcb33);
                        }
                        else if (0x1df < uVar23) {
                          pBt->pageSize = uVar19;
                          pBt->usableSize = uVar23;
                          uVar3 = *(uint *)(puVar20 + 0x34);
                          pBt->autoVacuum =
                               ((uVar3 >> 0x18 != 0 || (uVar3 & 0xff0000) != 0) ||
                               (uVar3 & 0xff00) != 0) || (uVar3 & 0xff) != 0;
                          uVar3 = *(uint *)(puVar20 + 0x40);
                          pBt->incrVacuum =
                               ((uVar3 >> 0x18 != 0 || (uVar3 & 0xff0000) != 0) ||
                               (uVar3 & 0xff00) != 0) || (uVar3 & 0xff) != 0;
                          goto LAB_0011e68c;
                        }
                      }
                    }
                  }
                }
              }
              sqlite3PagerUnref(pMVar8->pDbPage);
              pBt->pPage1 = (MemPage *)0x0;
              goto LAB_0011e932;
            }
            uVar23 = pBt->usableSize;
LAB_0011e68c:
            iVar14 = (uVar23 * 0x40 - 0x300) / 0xff - 0x17;
            uVar13 = (ushort)iVar14;
            pBt->maxLocal = uVar13;
            uVar17 = (short)((uVar23 * 0x20 - 0x180) / 0xff) - 0x17;
            pBt->minLocal = uVar17;
            pBt->maxLeaf = (short)uVar23 - 0x23;
            uVar11 = (u8)iVar14;
            if (0x7e < uVar13) {
              uVar11 = '\x7f';
            }
            pBt->minLeaf = uVar17;
            pBt->max1bytePayload = uVar11;
            pBt->pPage1 = pMVar8;
            pBt->nPage = uVar21;
LAB_0011e73c:
          } while (pBt->pPage1 == (MemPage *)0x0);
          iVar14 = 0;
        }
        if ((wrflag == 0) || (iVar14 != 0)) {
LAB_0011e906:
          p = local_48;
          if (iVar14 == 0) {
            if ((local_48->inTrans == '\0') &&
               (pBt->nTransaction = pBt->nTransaction + 1, local_48->sharable != '\0')) {
              (local_48->lock).eLock = '\x01';
              (local_48->lock).pNext = pBt->pLock;
              pBt->pLock = &local_48->lock;
            }
            bVar12 = 2 - (wrflag == 0);
            local_48->inTrans = bVar12;
            if (pBt->inTransaction < bVar12) {
              pBt->inTransaction = bVar12;
            }
            if (wrflag == 0) goto LAB_0011ea73;
            pMVar8 = pBt->pPage1;
            pBt->pWriter = local_48;
            pBt->btsFlags = (ushort)(1 < wrflag) << 5 | pBt->btsFlags & 0xffdf;
            uVar21 = *(uint *)(pMVar8->aData + 0x1c);
            if (pBt->nPage ==
                (uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18
                )) goto LAB_0011e33b;
            iVar14 = sqlite3PagerWrite(pMVar8->pDbPage);
            if (iVar14 != 0) break;
            uVar21 = pBt->nPage;
            *(uint *)(pMVar8->aData + 0x1c) =
                 uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18
            ;
            goto LAB_0011e33b;
          }
        }
        else {
          iVar14 = 8;
          if ((pBt->btsFlags & 1) == 0) {
            pPVar5 = pBt->pPager;
            iVar14 = pPVar5->errCode;
            if (iVar14 == 0) {
              pPVar5->subjInMemory = local_48->db->temp_store == '\x02';
              if (pPVar5->eState == '\x01') {
                pWVar22 = pPVar5->pWal;
                if (pWVar22 != (Wal *)0x0) {
                  if ((pPVar5->exclusiveMode != '\0') && (pWVar22->exclusiveMode == '\0')) {
                    if ((pPVar5->eLock < 4) || (pPVar5->eLock == 5)) {
                      iVar14 = (*pPVar5->fd->pMethods->xLock)(pPVar5->fd,4);
                      if (iVar14 != 0) goto LAB_0011e932;
                      pPVar5->eLock = '\x04';
                      pWVar22 = pPVar5->pWal;
                      puVar20 = &pWVar22->exclusiveMode;
                      if (pWVar22->exclusiveMode == '\0') goto LAB_0011e848;
                    }
                    else {
                      puVar20 = &pWVar22->exclusiveMode;
LAB_0011e848:
                      (*pWVar22->pDbFd->pMethods->xShmLock)
                                (pWVar22->pDbFd,pWVar22->readLock + 3,1,5);
                      pWVar22 = pPVar5->pWal;
                    }
                    *puVar20 = '\x01';
                  }
                  iVar14 = 8;
                  if ((pWVar22->readOnly == '\0') &&
                     ((pWVar22->exclusiveMode != '\0' ||
                      (iVar14 = (*pWVar22->pDbFd->pMethods->xShmLock)(pWVar22->pDbFd,0,1,10),
                      iVar14 == 0)))) {
                    pWVar22->writeLock = '\x01';
                    iVar14 = bcmp(&pWVar22->hdr,*pWVar22->apWiData,0x30);
                    if (iVar14 == 0) goto LAB_0011e8dc;
                    if (pWVar22->exclusiveMode == '\0') {
                      (*pWVar22->pDbFd->pMethods->xShmLock)(pWVar22->pDbFd,0,1,9);
                    }
                    pWVar22->writeLock = '\0';
                    iVar14 = 5;
                  }
                  goto LAB_0011e932;
                }
                if ((pPVar5->eLock < 6) && ((0x23U >> (pPVar5->eLock & 0x1f) & 1) != 0)) {
                  iVar14 = (*pPVar5->fd->pMethods->xLock)(pPVar5->fd,2);
                  if (iVar14 != 0) goto LAB_0011e932;
                  if (pPVar5->eLock != '\x05') {
                    pPVar5->eLock = '\x02';
                  }
                }
                if (1 < wrflag) {
                  do {
                    if ((3 < pPVar5->eLock) && (pPVar5->eLock != 5)) goto LAB_0011e8dc;
                    iVar14 = (*pPVar5->fd->pMethods->xLock)(pPVar5->fd,4);
                    if (iVar14 != 5) {
                      if (iVar14 != 0) goto LAB_0011e906;
                      pPVar5->eLock = '\x04';
                      goto LAB_0011e8dc;
                    }
                    iVar15 = (*pPVar5->xBusyHandler)(pPVar5->pBusyHandlerArg);
                    iVar14 = 5;
                  } while (iVar15 != 0);
                  goto LAB_0011e932;
                }
LAB_0011e8dc:
                pPVar5->eState = '\x02';
                PVar4 = pPVar5->dbSize;
                pPVar5->dbHintSize = PVar4;
                pPVar5->dbFileSize = PVar4;
                pPVar5->dbOrigSize = PVar4;
                pPVar5->journalOff = 0;
              }
              iVar14 = newDatabase(pBt);
              goto LAB_0011e906;
            }
          }
        }
LAB_0011e932:
        if ((pBt->inTransaction == '\0') && (pBt->pPage1 != (MemPage *)0x0)) {
          sqlite3PagerUnref(pBt->pPage1->pDbPage);
          pBt->pPage1 = (MemPage *)0x0;
        }
        p = local_48;
        if (((char)iVar14 != '\x05') || (pBt->inTransaction != '\0')) break;
        psVar6 = pBt->db;
        p_Var7 = (psVar6->busyHandler).xFunc;
        if ((p_Var7 == (_func_int_void_ptr_int *)0x0) ||
           (iVar15 = (psVar6->busyHandler).nBusy, iVar15 < 0)) break;
        iVar15 = (*p_Var7)((psVar6->busyHandler).pArg,iVar15);
        if (iVar15 == 0) goto LAB_0011e9b7;
        piVar1 = &(psVar6->busyHandler).nBusy;
        *piVar1 = *piVar1 + 1;
      } while( true );
    }
    goto LAB_0011ea76;
  }
LAB_0011ea73:
  iVar14 = 0;
LAB_0011ea76:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar9 = p->pBt->mutex;
      if (psVar9 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar9);
      }
      p->locked = '\0';
    }
  }
  return iVar14;
LAB_0011e9b7:
  (psVar6->busyHandler).nBusy = -1;
  goto LAB_0011ea76;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag){
  sqlite3 *pBlock = 0;
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( IfNotOmitAV(pBt->bDoTruncate)==0 );

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  /* If another database handle has already opened a write transaction 
  ** on this shared-btree structure and a second write transaction is
  ** requested, return SQLITE_LOCKED.
  */
  if( (wrflag && pBt->inTransaction==TRANS_WRITE)
   || (pBt->btsFlags & BTS_PENDING)!=0
  ){
    pBlock = pBt->pWriter->db;
  }else if( wrflag>1 ){
    BtLock *pIter;
    for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
      if( pIter->pBtree!=p ){
        pBlock = pIter->pBtree->db;
        break;
      }
    }
  }
  if( pBlock ){
    sqlite3ConnectionBlocked(p->db, pBlock);
    rc = SQLITE_LOCKED_SHAREDCACHE;
    goto trans_begun;
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }


trans_begun:
  if( rc==SQLITE_OK && wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}